

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvc.c
# Opt level: O3

err_t cvcMatch(int argc,char **argv)

{
  char **names;
  err_t eVar1;
  octet *privkey;
  octet *cert;
  cmd_pwd_t pwd;
  size_t cert_len;
  int readc;
  size_t privkey_len;
  
  eVar1 = cmdStDo(8);
  if (eVar1 != 0) {
    return eVar1;
  }
  eVar1 = cvcParseOptions((btok_cvc_t *)0x0,(bool_t *)0x0,(bool_t *)0x0,&pwd,(octet *)0x0,&readc,
                          argc,argv);
  if (eVar1 != 0) {
    return eVar1;
  }
  if (argc - readc != 2) {
    cmdPwdClose(pwd);
    return 0x25b;
  }
  names = argv + readc;
  eVar1 = cmdFileValExist(2,names);
  if (eVar1 != 0) {
    return eVar1;
  }
  privkey_len = 0;
  eVar1 = cmdPrivkeyRead((octet *)0x0,&privkey_len,*names,pwd);
  if (eVar1 != 0) {
    cmdPwdClose(pwd);
    return eVar1;
  }
  privkey = (octet *)blobCreate(privkey_len);
  if (privkey == (octet *)0x0) {
    cmdPwdClose(pwd);
LAB_00109a29:
    eVar1 = 0x6e;
  }
  else {
    eVar1 = cmdPrivkeyRead(privkey,(size_t *)0x0,*names,pwd);
    cmdPwdClose(pwd);
    if ((eVar1 == 0) && (eVar1 = cmdFileReadAll((void *)0x0,&cert_len,names[1]), eVar1 == 0)) {
      cert = (octet *)blobCreate(cert_len);
      if (cert == (octet *)0x0) {
        blobClose(privkey);
        goto LAB_00109a29;
      }
      eVar1 = cmdFileReadAll(cert,&cert_len,names[1]);
      if (eVar1 == 0) {
        eVar1 = btokCVCMatch(cert,cert_len,privkey,privkey_len);
        blobClose(cert);
      }
      else {
        blobClose(privkey);
        privkey = cert;
      }
    }
    blobClose(privkey);
  }
  return eVar1;
}

Assistant:

static err_t cvcMatch(int argc, char* argv[])
{
	err_t code;
	cmd_pwd_t pwd;
	int readc;
	size_t privkey_len;
	octet* privkey;
	size_t cert_len;
	octet* cert;
	// самотестирование
	code = cmdStDo(CMD_ST_BIGN);
	ERR_CALL_CHECK(code);
	// обработать опции
	code = cvcParseOptions(0, 0, 0, &pwd, 0, &readc, argc, argv);
	ERR_CALL_CHECK(code);
	argc -= readc, argv += readc;
	if (argc != 2)
		code = ERR_CMD_PARAMS;
	ERR_CALL_HANDLE(code, cmdPwdClose(pwd));
	// проверить наличие/отсутствие файлов
	code = cmdFileValExist(2, argv);
	ERR_CALL_CHECK(code);
	// прочитать личный ключ
	privkey_len = 0;
	code = cmdPrivkeyRead(0, &privkey_len, argv[0], pwd);
	ERR_CALL_HANDLE(code, cmdPwdClose(pwd));
	code = cmdBlobCreate(privkey, privkey_len);
	ERR_CALL_HANDLE(code, cmdPwdClose(pwd));
	code = cmdPrivkeyRead(privkey, 0, argv[0], pwd);
	cmdPwdClose(pwd);
	ERR_CALL_HANDLE(code, cmdBlobClose(privkey));
	// определить длину сертификата
	code = cmdFileReadAll(0, &cert_len, argv[1]);
	ERR_CALL_HANDLE(code, cmdBlobClose(privkey));
	// прочитать сертификат
	code = cmdBlobCreate(cert, cert_len);
	ERR_CALL_HANDLE(code, cmdBlobClose(privkey));
	code = cmdFileReadAll(cert, &cert_len, argv[1]);
	ERR_CALL_HANDLE(code, (cmdBlobClose(privkey), cmdBlobClose(cert)));
	// проверить соответствие
	code = btokCVCMatch(cert, cert_len, privkey, privkey_len);
	// завершить
	cmdBlobClose(cert);
	cmdBlobClose(privkey);
	return code;
}